

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O1

char * flag_string(flag_type *flag_table,long *bits)

{
  flag_type *pfVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  flag_type *pfVar7;
  long lVar8;
  bool bVar9;
  double dVar10;
  
  flag_string::buf[0] = '\0';
  if (flag_table->name != (char *)0x0) {
    lVar8 = 0;
    do {
      pfVar1 = flag_table + lVar8;
      bVar9 = true;
      lVar4 = 0x10;
      pfVar7 = area_flags;
      do {
        if ((pfVar7 == flag_table) && ((&UNK_004ab748)[lVar4] != '\0')) break;
        pfVar7 = *(flag_type **)((long)&flag_stat_table[0].structure + lVar4);
        bVar9 = pfVar7 != (flag_type *)0x0;
        lVar4 = lVar4 + 0x10;
      } while (lVar4 != 0x1d0);
      if (bVar9) {
LAB_0036bf54:
        uVar2 = pfVar1->bit;
        uVar6 = uVar2 + 0x1f;
        if (-1 < (long)uVar2) {
          uVar6 = uVar2;
        }
        uVar6 = bits[(int)(uVar6 >> 5)];
        dVar10 = exp2((double)((long)uVar2 % 0x20));
        if ((uVar6 & (long)dVar10) != 0) {
          sVar5 = strlen(flag_string::buf);
          (flag_string::buf + sVar5)[0] = ' ';
          (flag_string::buf + sVar5)[1] = '\0';
          strcat(flag_string::buf,pfVar1->name);
          break;
        }
      }
      else {
        uVar2 = pfVar1->bit;
        uVar6 = uVar2 + 0x1f;
        if (-1 < (long)uVar2) {
          uVar6 = uVar2;
        }
        uVar6 = bits[(int)(uVar6 >> 5)];
        dVar10 = exp2((double)((long)uVar2 % 0x20));
        if ((uVar6 & (long)dVar10) == 0) goto LAB_0036bf54;
        sVar5 = strlen(flag_string::buf);
        (flag_string::buf + sVar5)[0] = ' ';
        (flag_string::buf + sVar5)[1] = '\0';
        strcat(flag_string::buf,pfVar1->name);
      }
      lVar8 = lVar8 + 1;
    } while (flag_table[lVar8].name != (char *)0x0);
  }
  pcVar3 = flag_string::buf;
  if (flag_string::buf[0] == '\0') {
    pcVar3 = " none";
  }
  return pcVar3 + 1;
}

Assistant:

char *flag_string(const struct flag_type *flag_table, long bits[])
{
	static char buf[512];
	int flag;

	buf[0] = '\0';

	for (flag = 0; flag_table[flag].name != nullptr; flag++)
	{
		if (!is_stat(flag_table) && IS_SET(bits, flag_table[flag].bit))
		{
			strcat(buf, " ");
			strcat(buf, flag_table[flag].name);
		}
		else if (IS_SET(bits, flag_table[flag].bit))
		{
			strcat(buf, " ");
			strcat(buf, flag_table[flag].name);
			break;
		}
	}

	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}